

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylnsymmat.cpp
# Opt level: O0

int __thiscall
TPZSkylNSymMatrix<double>::Subst_LForward(TPZSkylNSymMatrix<double> *this,TPZFMatrix<double> *B)

{
  int64_t iVar1;
  long lVar2;
  double **ppdVar3;
  double *col;
  TPZBaseMatrix *in_RSI;
  long *in_RDI;
  double *BPtr;
  double *end_ki;
  double *elem_ki;
  double sum;
  int64_t j;
  int64_t k;
  int64_t dimension;
  double *in_stack_ffffffffffffffb0;
  TPZFMatrix<double> *row;
  TPZFMatrix<double> *this_00;
  double local_38;
  long local_30;
  long local_28;
  int local_4;
  
  iVar1 = TPZBaseMatrix::Rows(in_RSI);
  lVar2 = (**(code **)(*in_RDI + 0x60))();
  if ((iVar1 == lVar2) && (((char)in_RDI[3] == '\x04' || ((char)in_RDI[3] == '\x01')))) {
    lVar2 = (**(code **)(*in_RDI + 0x60))();
    for (local_28 = 0; local_28 < lVar2; local_28 = local_28 + 1) {
      local_30 = 0;
      while( true ) {
        iVar1 = TPZBaseMatrix::Cols(in_RSI);
        if (iVar1 <= local_30) break;
        local_38 = 0.0;
        ppdVar3 = TPZVec<double_*>::operator[]((TPZVec<double_*> *)(in_RDI + 8),local_28);
        this_00 = (TPZFMatrix<double> *)(*ppdVar3 + 1);
        ppdVar3 = TPZVec<double_*>::operator[]((TPZVec<double_*> *)(in_RDI + 8),local_28 + 1);
        row = (TPZFMatrix<double> *)*ppdVar3;
        col = TPZFMatrix<double>::operator()
                        (this_00,(int64_t)row,(int64_t)in_stack_ffffffffffffffb0);
        for (; this_00 < row;
            this_00 = (TPZFMatrix<double> *)
                      &(this_00->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow) {
          local_38 = (double)(this_00->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable
                             ._vptr_TPZSavable * col[-1] + local_38;
          col = col + -1;
        }
        in_stack_ffffffffffffffb0 =
             TPZFMatrix<double>::operator()(this_00,(int64_t)row,(int64_t)col);
        *in_stack_ffffffffffffffb0 = *in_stack_ffffffffffffffb0 - local_38;
        local_30 = local_30 + 1;
      }
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int TPZSkylNSymMatrix<TVar>::Subst_LForward(TPZFMatrix<TVar> *B)const
{
  if ((B->Rows() != this->Dim()) || (this->fDecomposed != ELDLt && this->fDecomposed != ELU))
    return(0);

  int64_t dimension = this->Dim();
  for (int64_t k = 0; k < dimension; k++)
  {
    for (int64_t j = 0; j < B->Cols(); j++)
    {
      // Faz sum = SOMA( A[k,i] * B[i,j] ), para i = 1, ..., k-1.
      //
      TVar sum = 0.0;
      TVar *elem_ki = fElemb[k] + 1;
      TVar *end_ki = fElemb[k + 1];
      TVar *BPtr = &(*B)(k, j);
      while (elem_ki < end_ki)
        sum += (*elem_ki++) * (*--BPtr);

      // Faz B[k,j] = (B[k,j] - sum) / A[k,k].
      //
      // B->PutVal( k, j, (B->GetVal(k, j) - sum) / row_k->pElem[0] );
      BPtr = &(*B)(k, j);
      *BPtr -= sum;
    }
  }
  return(1);
}